

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ScatterAlongAxisLayerParams::SerializeWithCachedSizes
          (ScatterAlongAxisLayerParams *this,CodedOutputStream *output)

{
  ScatterMode SVar1;
  int64 iVar2;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  ScatterAlongAxisLayerParams *this_local;
  
  iVar2 = axis(this);
  if (iVar2 != 0) {
    iVar2 = axis(this);
    google::protobuf::internal::WireFormatLite::WriteInt64(1,iVar2,output);
  }
  SVar1 = mode(this);
  if (SVar1 != SCATTER_UPDATE) {
    SVar1 = mode(this);
    google::protobuf::internal::WireFormatLite::WriteEnum(2,SVar1,output);
  }
  return;
}

Assistant:

void ScatterAlongAxisLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.ScatterAlongAxisLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // int64 axis = 1;
  if (this->axis() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(1, this->axis(), output);
  }

  // .CoreML.Specification.ScatterMode mode = 2;
  if (this->mode() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      2, this->mode(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.ScatterAlongAxisLayerParams)
}